

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O0

SUNMemoryHelper SUNMemoryHelper_NewEmpty(SUNContext sunctx)

{
  SUNMemoryHelper_Ops p_Var1;
  SUNContext in_RDI;
  SUNMemoryHelper helper;
  SUNMemoryHelper local_8;
  
  if (in_RDI == (SUNContext)0x0) {
    local_8 = (SUNMemoryHelper)0x0;
  }
  else {
    local_8 = (SUNMemoryHelper)malloc(0x18);
    if (local_8 == (SUNMemoryHelper)0x0) {
      local_8 = (SUNMemoryHelper)0x0;
    }
    else {
      p_Var1 = (SUNMemoryHelper_Ops)malloc(0x30);
      local_8->ops = p_Var1;
      if (local_8->ops == (SUNMemoryHelper_Ops)0x0) {
        free(local_8);
        local_8 = (SUNMemoryHelper)0x0;
      }
      else {
        memset(local_8->ops,0,0x30);
        local_8->content = (void *)0x0;
        local_8->sunctx = in_RDI;
      }
    }
  }
  return local_8;
}

Assistant:

SUNMemoryHelper SUNMemoryHelper_NewEmpty(SUNContext sunctx)
{
  SUNMemoryHelper helper = NULL;

  if (sunctx == NULL) return(NULL);

  helper = (SUNMemoryHelper) malloc(sizeof(struct _SUNMemoryHelper));
  if (helper == NULL)
  {
    SUNDIALS_DEBUG_PRINT("ERROR in SUNMemoryHelper_NewEmpty: malloc failed\n");
    return(NULL);
  }

  helper->ops = (SUNMemoryHelper_Ops) malloc(sizeof(struct _SUNMemoryHelper_Ops));
  if (helper->ops == NULL)
  {
    SUNDIALS_DEBUG_PRINT("ERROR in SUNMemoryHelper_NewEmpty: malloc failed\n");
    free(helper);
    return(NULL);
  }

  /* Set all ops to NULL */
  memset(helper->ops, 0, sizeof(struct _SUNMemoryHelper_Ops));
  helper->content = NULL;
  helper->sunctx = sunctx;

  return(helper);
}